

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

compare_eq_result_container<QList<QPointF>,_QPointF> __thiscall
QList<QPointF>::operator==(QList<QPointF> *this,QList<QPointF> *other)

{
  bool bVar1;
  QPointF *p1;
  QPointF *p2;
  long lVar2;
  
  lVar2 = (this->d).size;
  if (lVar2 == (other->d).size) {
    p1 = (this->d).ptr;
    p2 = (other->d).ptr;
    bVar1 = true;
    if ((p1 != p2) && (lVar2 != 0)) {
      lVar2 = lVar2 * 0x10;
      do {
        lVar2 = lVar2 + -0x10;
        bVar1 = qFuzzyCompare(p1,p2);
        if (!bVar1) {
          return bVar1;
        }
        p1 = p1 + 1;
        p2 = p2 + 1;
      } while (lVar2 != 0);
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

constexpr qsizetype size() const noexcept
    {
#if __has_cpp_attribute(assume)
        constexpr size_t MaxSize = maxSize();
        [[assume(size_t(d.size) <= MaxSize)]];
#endif
        return d.size;
    }